

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void codeDistinct(Parse *pParse,int iTab,int addrRepeat,int N,int iMem)

{
  Vdbe *p;
  Op *pOVar1;
  byte bVar2;
  int iVar3;
  int p3;
  
  p = pParse->pVdbe;
  if (pParse->nTempReg == '\0') {
    p3 = pParse->nMem + 1;
    pParse->nMem = p3;
  }
  else {
    bVar2 = pParse->nTempReg - 1;
    pParse->nTempReg = bVar2;
    p3 = pParse->aTempReg[bVar2];
  }
  iVar3 = sqlite3VdbeAddOp3(p,0x1d,iTab,addrRepeat,iMem);
  if (p->db->mallocFailed == '\0') {
    pOVar1 = p->aOp;
    pOVar1[iVar3].p4type = -3;
    pOVar1[iVar3].p4.i = N;
  }
  sqlite3VdbeAddOp3(p,0x5c,iMem,N,p3);
  iVar3 = sqlite3VdbeAddOp3(p,0x84,iTab,p3,iMem);
  if (p->db->mallocFailed == '\0') {
    pOVar1 = p->aOp;
    pOVar1[iVar3].p4type = -3;
    pOVar1[iVar3].p4.i = N;
  }
  if (0 < (long)p->nOp) {
    p->aOp[(long)p->nOp + -1].p5 = 0x10;
  }
  if (p3 != 0) {
    bVar2 = pParse->nTempReg;
    if ((ulong)bVar2 < 8) {
      pParse->nTempReg = bVar2 + 1;
      pParse->aTempReg[bVar2] = p3;
    }
  }
  return;
}

Assistant:

static void codeDistinct(
  Parse *pParse,     /* Parsing and code generating context */
  int iTab,          /* A sorting index used to test for distinctness */
  int addrRepeat,    /* Jump to here if not distinct */
  int N,             /* Number of elements */
  int iMem           /* First element */
){
  Vdbe *v;
  int r1;

  v = pParse->pVdbe;
  r1 = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp4Int(v, OP_Found, iTab, addrRepeat, iMem, N); VdbeCoverage(v);
  sqlite3VdbeAddOp3(v, OP_MakeRecord, iMem, N, r1);
  sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iTab, r1, iMem, N);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  sqlite3ReleaseTempReg(pParse, r1);
}